

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O1

void gpc_sRGB(Pixel *out,Pixel *in,Background *back)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  double dVar4;
  
  dVar4 = (double)in->r / 65535.0;
  if (dVar4 <= 0.0031308) {
    dVar4 = dVar4 * 12.92;
  }
  else {
    dVar4 = pow(dVar4,0.4166666666666667);
    dVar4 = dVar4 * 1.055 + -0.055;
  }
  dVar4 = floor(dVar4 * 255.0 + 0.5);
  uVar3 = (int)dVar4 & 0xff;
  out->r = uVar3;
  iVar1 = in->r;
  if (in->g == iVar1) {
    out->g = uVar3;
    iVar2 = in->b;
    if (iVar2 == iVar1) goto LAB_0010d0e4;
  }
  else {
    dVar4 = (double)in->g / 65535.0;
    if (dVar4 <= 0.0031308) {
      dVar4 = dVar4 * 12.92;
    }
    else {
      dVar4 = pow(dVar4,0.4166666666666667);
      dVar4 = dVar4 * 1.055 + -0.055;
    }
    dVar4 = floor(dVar4 * 255.0 + 0.5);
    uVar3 = (int)dVar4 & 0xff;
    out->g = uVar3;
    iVar2 = in->b;
    if (iVar2 == in->r) {
      uVar3 = out->r;
      goto LAB_0010d0e4;
    }
    if (iVar2 == in->g) goto LAB_0010d0e4;
  }
  dVar4 = (double)iVar2 / 65535.0;
  if (dVar4 <= 0.0031308) {
    dVar4 = dVar4 * 12.92;
  }
  else {
    dVar4 = pow(dVar4,0.4166666666666667);
    dVar4 = dVar4 * 1.055 + -0.055;
  }
  dVar4 = floor(dVar4 * 255.0 + 0.5);
  uVar3 = (int)dVar4 & 0xff;
LAB_0010d0e4:
  out->b = uVar3;
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_sRGB(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;

   out->r = isRGB(in->r);

   if (in->g == in->r)
   {
      out->g = out->r;

      if (in->b == in->r)
         out->b = out->r;

      else
         out->b = isRGB(in->b);
   }

   else
   {
      out->g = isRGB(in->g);

      if (in->b == in->r)
         out->b = out->r;

      else if (in->b == in->g)
         out->b = out->g;

      else
         out->b = isRGB(in->b);
   }

   out->a = 255;
}